

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::fullPrice(HEkk *this,HVector *full_col,HVector *full_row)

{
  HighsSimplexAnalysis *this_00;
  
  this_00 = &this->analysis_;
  HighsSimplexAnalysis::simplexTimerStart(this_00,0x41,0);
  HVectorBase<double>::clear(full_row);
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore(this_00,1,full_col,1.0);
  }
  HighsSparseMatrix::priceByColumn(&(this->lp_).a_matrix_,false,full_row,full_col,-2);
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this_00,1,full_row);
  }
  HighsSimplexAnalysis::simplexTimerStop(this_00,0x41,0);
  return;
}

Assistant:

void HEkk::fullPrice(const HVector& full_col, HVector& full_row) {
  analysis_.simplexTimerStart(PriceFullClock);
  full_row.clear();
  if (analysis_.analyse_simplex_summary_data) {
    const double expected_density = 1;
    analysis_.operationRecordBefore(kSimplexNlaPriceFull, full_col,
                                    expected_density);
  }
  const bool quad_precision = false;
  lp_.a_matrix_.priceByColumn(quad_precision, full_row, full_col);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaPriceFull, full_row);
  analysis_.simplexTimerStop(PriceFullClock);
}